

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void DecodeDistanceBlockSwitch(BrotliDecoderStateInternal *s)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint32_t uVar4;
  bool bVar5;
  uint uVar6;
  BrotliBitReader *pBVar7;
  uint uVar8;
  BrotliDecoderStateInternal *s_local;
  BrotliBitReaderState memento;
  uint32_t block_type;
  uint32_t *ringbuffer;
  BrotliBitReader *br;
  HuffmanCode *len_tree;
  HuffmanCode *type_tree;
  uint32_t max_block_type;
  uint32_t nbits_5;
  uint32_t bits;
  uint32_t index;
  uint32_t val_2;
  uint32_t val_1;
  uint32_t nbits_3;
  uint32_t nbits_4;
  uint32_t nbits;
  HuffmanCode *local_1a0;
  uint32_t nbits_1;
  uint32_t code;
  uint32_t nbits_2;
  HuffmanCode *local_138;
  uint32_t val;
  
  uVar3 = s->num_block_types[2];
  local_1a0 = s->block_type_trees;
  local_138 = s->block_len_trees;
  pBVar7 = &s->br;
  if (uVar3 < 2) {
    bVar5 = false;
  }
  else {
    if (0x1f < (s->br).bit_pos_) {
      pBVar7->val_ = pBVar7->val_ >> 0x20;
      (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
      pBVar7->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar7->val_;
      (s->br).avail_in = (s->br).avail_in - 4;
      (s->br).next_in = (s->br).next_in + 4;
    }
    uVar6 = (uint)(pBVar7->val_ >> ((byte)(s->br).bit_pos_ & 0x3f));
    local_1a0 = local_1a0 + (ulong)(uVar6 & 0xff) + 0x4f0;
    if (8 < local_1a0->bits) {
      bVar1 = local_1a0->bits;
      (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
      local_1a0 = local_1a0 + ((uint)local_1a0->value + (uVar6 >> 8 & kBitMask[bVar1 - 8]));
    }
    (s->br).bit_pos_ = (uint)local_1a0->bits + (s->br).bit_pos_;
    uVar6 = (uint)local_1a0->value;
    if (0x1f < (s->br).bit_pos_) {
      pBVar7->val_ = pBVar7->val_ >> 0x20;
      (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
      pBVar7->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar7->val_;
      (s->br).avail_in = (s->br).avail_in - 4;
      (s->br).next_in = (s->br).next_in + 4;
    }
    uVar8 = (uint)(pBVar7->val_ >> ((byte)(s->br).bit_pos_ & 0x3f));
    local_138 = local_138 + (ulong)(uVar8 & 0xff) + 0x318;
    if (8 < local_138->bits) {
      bVar1 = local_138->bits;
      (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
      local_138 = local_138 + ((uint)local_138->value + (uVar8 >> 8 & kBitMask[bVar1 - 8]));
    }
    (s->br).bit_pos_ = (uint)local_138->bits + (s->br).bit_pos_;
    bVar1 = kBlockLengthPrefixCode[(uint)local_138->value].nbits;
    uVar2 = kBlockLengthPrefixCode[(uint)local_138->value].offset;
    if (0x1f < (s->br).bit_pos_) {
      pBVar7->val_ = pBVar7->val_ >> 0x20;
      (s->br).bit_pos_ = (s->br).bit_pos_ ^ 0x20;
      pBVar7->val_ = (ulong)*(uint *)(s->br).next_in << 0x20 | pBVar7->val_;
      (s->br).avail_in = (s->br).avail_in - 4;
      (s->br).next_in = (s->br).next_in + 4;
    }
    uVar4 = (s->br).bit_pos_;
    uVar8 = kBitMask[(uint)bVar1];
    (s->br).bit_pos_ = (uint)bVar1 + (s->br).bit_pos_;
    s->block_length[2] = (uint)uVar2 + ((uint)(pBVar7->val_ >> ((byte)uVar4 & 0x3f)) & uVar8);
    if (uVar6 == 1) {
      memento.avail_in._4_4_ = s->block_type_rb[5] + 1;
    }
    else if (uVar6 == 0) {
      memento.avail_in._4_4_ = s->block_type_rb[4];
    }
    else {
      memento.avail_in._4_4_ = uVar6 - 2;
    }
    if (uVar3 <= memento.avail_in._4_4_) {
      memento.avail_in._4_4_ = memento.avail_in._4_4_ - uVar3;
    }
    s->block_type_rb[4] = s->block_type_rb[5];
    s->block_type_rb[5] = memento.avail_in._4_4_;
    bVar5 = true;
  }
  if (bVar5) {
    s->dist_context_map_slice = s->dist_context_map + (s->block_type_rb[5] << 2);
    s->dist_htree_index = s->dist_context_map_slice[s->distance_context];
  }
  return;
}

Assistant:

static void BROTLI_NOINLINE DecodeDistanceBlockSwitch(BrotliDecoderState* s) {
  DecodeDistanceBlockSwitchInternal(0, s);
}